

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  sxu32 sVar1;
  uint uVar2;
  lhash_bmap_rec *pSrc;
  lhash_bmap_rec **pSrc_00;
  uint local_4c;
  sxu32 n;
  lhash_bmap_rec **apNew;
  lhash_bmap_rec *pEntry;
  sxu32 nNewSize;
  sxu32 iBucket;
  lhash_bmap_rec *pRec;
  pgno iReal_local;
  pgno iLogic_local;
  lhash_kv_engine *pEngine_local;
  
  pSrc = (lhash_bmap_rec *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x30);
  if (pSrc == (lhash_bmap_rec *)0x0) {
    pEngine_local._4_4_ = -1;
  }
  else {
    SyZero(pSrc,0x30);
    pSrc->iLogic = iLogic;
    pSrc->iReal = iReal;
    uVar2 = (uint)iLogic & pEngine->nBuckSize - 1;
    pSrc->pNextCol = pEngine->apMap[uVar2];
    if (pEngine->apMap[uVar2] != (lhash_bmap_rec *)0x0) {
      pEngine->apMap[uVar2]->pPrevCol = pSrc;
    }
    pEngine->apMap[uVar2] = pSrc;
    if (pEngine->pFirst == (lhash_bmap_rec *)0x0) {
      pEngine->pList = pSrc;
      pEngine->pFirst = pSrc;
    }
    else if (pEngine->pList == (lhash_bmap_rec *)0x0) {
      pEngine->pList = pSrc;
    }
    else {
      pSrc->pNext = pEngine->pList;
      pEngine->pList->pPrev = pSrc;
      pEngine->pList = pSrc;
    }
    pEngine->nBuckRec = pEngine->nBuckRec + 1;
    if ((pEngine->nBuckSize * 3 <= pEngine->nBuckRec) && (pEngine->nBuckRec < 100000)) {
      sVar1 = pEngine->nBuckSize;
      pSrc_00 = (lhash_bmap_rec **)SyMemBackendAlloc(&pEngine->sAllocator,sVar1 << 4);
      if (pSrc_00 != (lhash_bmap_rec **)0x0) {
        SyZero(pSrc_00,sVar1 << 4);
        local_4c = 0;
        apNew = (lhash_bmap_rec **)pEngine->pList;
        for (; local_4c < pEngine->nBuckRec; local_4c = local_4c + 1) {
          apNew[5] = (lhash_bmap_rec *)0x0;
          apNew[4] = (lhash_bmap_rec *)0x0;
          uVar2 = (uint)*apNew & sVar1 * 2 - 1;
          apNew[4] = pSrc_00[uVar2];
          if (pSrc_00[uVar2] != (lhash_bmap_rec *)0x0) {
            pSrc_00[uVar2]->pPrevCol = (lhash_bmap_rec *)apNew;
          }
          pSrc_00[uVar2] = (lhash_bmap_rec *)apNew;
          apNew = (lhash_bmap_rec **)apNew[2];
        }
        SyMemBackendFree(&pEngine->sAllocator,pEngine->apMap);
        pEngine->apMap = pSrc_00;
        pEngine->nBuckSize = sVar1 * 2;
      }
    }
    pEngine_local._4_4_ = 0;
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhMapInstallBucket(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_rec *pRec;
	sxu32 iBucket;
	/* Allocate a new instance */
	pRec = (lhash_bmap_rec *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhash_bmap_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(lhash_bmap_rec));
	/* Fill in the structure */
	pRec->iLogic = iLogic;
	pRec->iReal = iReal;
	iBucket = iLogic & (pEngine->nBuckSize - 1);
	pRec->pNextCol = pEngine->apMap[iBucket];
	if( pEngine->apMap[iBucket] ){
		pEngine->apMap[iBucket]->pPrevCol = pRec;
	}
	pEngine->apMap[iBucket] = pRec;
	/* Link */
	if( pEngine->pFirst == 0 ){
		pEngine->pFirst = pEngine->pList = pRec;
	}else{
		MACRO_LD_PUSH(pEngine->pList,pRec);
	}
	pEngine->nBuckRec++;
	if( (pEngine->nBuckRec >= pEngine->nBuckSize * 3) && pEngine->nBuckRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pEngine->nBuckSize << 1;
		lhash_bmap_rec *pEntry;
		lhash_bmap_rec **apNew;
		sxu32 n;
		
		apNew = (lhash_bmap_rec **)SyMemBackendAlloc(&pEngine->sAllocator, nNewSize * sizeof(lhash_bmap_rec *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhash_bmap_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = pEngine->pList;
			for(;;){
				/* Loop one */
				if( n >= pEngine->nBuckRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iLogic & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pEngine->sAllocator,(void *)pEngine->apMap);
			pEngine->apMap = apNew;
			pEngine->nBuckSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}